

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_originator.c
# Opt level: O2

_Bool olsrv2_originator_is_local(netaddr *addr)

{
  int iVar1;
  long lVar2;
  _Bool _Var3;
  
  iVar1 = bcmp(&_originator_v4,addr,0x12);
  _Var3 = true;
  if (iVar1 != 0) {
    iVar1 = bcmp(&_originator_v6,addr,0x12);
    if (iVar1 != 0) {
      lVar2 = avl_find(&_originator_set_tree,addr);
      _Var3 = lVar2 != 0;
    }
  }
  return _Var3;
}

Assistant:

bool
olsrv2_originator_is_local(const struct netaddr *addr) {
  if (netaddr_cmp(&_originator_v4, addr) == 0) {
    return true;
  }
  if (netaddr_cmp(&_originator_v6, addr) == 0) {
    return true;
  }
  return olsrv2_originator_get_entry(addr) != NULL;
}